

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

string * LogCategoryToStr_abi_cxx11_(LogFlags category)

{
  long lVar1;
  bool bVar2;
  _Node_iterator_base<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  this;
  _Node_iterator_base<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  __str;
  long in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  _Node_const_iterator<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
  *in_stack_ffffffffffffff98;
  unordered_map<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  _Node_iterator_base<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  *in_stack_ffffffffffffffa8;
  allocator<char> *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  }
  else {
    this._M_cur = (__node_type *)
                  std::
                  unordered_map<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(in_stack_ffffffffffffffa0,(key_type *)in_stack_ffffffffffffff98);
    __str._M_cur = (__node_type *)
                   std::
                   unordered_map<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end(in_stack_ffffffffffffffa0);
    bVar2 = std::__detail::operator==
                      (in_stack_ffffffffffffffa8,
                       (_Node_iterator_base<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                        *)in_stack_ffffffffffffffa0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("it != LOG_CATEGORIES_BY_FLAG.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                    ,0xfc,"std::string LogCategoryToStr(BCLog::LogFlags)");
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ::operator->(in_stack_ffffffffffffff98);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this._M_cur,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str._M_cur);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::string LogCategoryToStr(BCLog::LogFlags category)
{
    if (category == BCLog::ALL) {
        return "all";
    }
    auto it = LOG_CATEGORIES_BY_FLAG.find(category);
    assert(it != LOG_CATEGORIES_BY_FLAG.end());
    return it->second;
}